

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::set_internal_parameters(IMLE *this)

{
  size_type sVar1;
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_RDI;
  double dVar2;
  Scalar SVar3;
  double dVar4;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_ffffffffffffff88;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffff90;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff98;
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_stack_ffffffffffffffa0;
  
  sVar1 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
          size((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
               (in_RDI + 0x16));
  *(int *)&in_RDI[0x19].m_df = (int)sVar1;
  if (*(int *)&in_RDI[0x19].m_df == 0) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Constant
              ((Index)in_RDI,&in_stack_ffffffffffffffa0->m_df);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              (in_stack_ffffffffffffff90,
               (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff88);
  }
  boost::math::
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::chi_squared_distribution(in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
  dVar2 = boost::math::
          quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    (in_RDI,&in_stack_ffffffffffffffa0->m_df);
  dVar2 = exp(dVar2 * -0.5);
  in_RDI[0x24].m_df = dVar2;
  boost::math::
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::chi_squared_distribution(in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
  dVar2 = boost::math::
          quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    (in_RDI,&in_stack_ffffffffffffffa0->m_df);
  dVar2 = exp(dVar2 * -0.5);
  in_RDI[0x23].m_df = dVar2;
  boost::math::
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::chi_squared_distribution(in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
  dVar2 = boost::math::
          quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    (in_RDI,&in_stack_ffffffffffffffa0->m_df);
  dVar2 = exp(dVar2 * -0.5);
  in_RDI[0x25].m_df = dVar2;
  dVar2 = in_RDI[0x24].m_df;
  SVar3 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod(in_stack_ffffffffffffff98)
  ;
  dVar4 = sqrt(SVar3);
  in_RDI[0x21].m_df = dVar2 / dVar4;
  dVar2 = in_RDI[0x23].m_df;
  SVar3 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod(in_stack_ffffffffffffff98)
  ;
  dVar4 = sqrt(SVar3);
  in_RDI[0x20].m_df = dVar2 / dVar4;
  dVar2 = in_RDI[0x25].m_df;
  this_00 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                      (in_stack_ffffffffffffff98);
  SVar3 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod(this_00);
  dVar4 = sqrt((double)this_00 * SVar3);
  in_RDI[0x22].m_df = dVar2 / dVar4;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::set_internal_parameters()
{
    // Number of experts
    M = experts.size();

    // Initial guess for hyperparameters
    if( M == 0 )
    {
        Sigma = Z::Constant(d,param.sigma0);  //Template: Z::Constant(param.sigma0)
        Psi = param.Psi0;
    }

    // Significance test level
    sig_level_noiseX_rbf = exp(-0.5* quantile(boost::math::chi_squared(D), 1.0 - param.p0) );
    sig_level_noiseZ_rbf = exp(-0.5* quantile(boost::math::chi_squared(d), 1.0 - param.p0) );
    sig_level_noiseZX_rbf = exp(-0.5* quantile(boost::math::chi_squared(D+d), 1.0 - param.p0) );

    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf/ sqrt(Psi.prod() * Sigma.prod());
}